

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

void Gia_ManSweepComputeOneDomainEquivs
               (Gia_Man_t *p,Vec_Int_t *vRegClasses,int iDom,void *pParsS,int fConst,int fEquiv,
               int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  int nDoms;
  int nFlops;
  int Class;
  int i;
  Vec_Int_t *vPerm;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int fEquiv_local;
  int fConst_local;
  void *pParsS_local;
  int iDom_local;
  Vec_Int_t *vRegClasses_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntFindMax(vRegClasses);
  if ((iDom < 1) || (iVar1 < iDom)) {
    __assert_fail("iDom >= 1 && iDom <= nDoms",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x265,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  if (p->pManTime != (void *)0x0) {
    __assert_fail("p->pManTime == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x266,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x267,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  iVar1 = Gia_ManRegNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  for (nFlops = 0; iVar1 = Vec_IntSize(vRegClasses), nFlops < iVar1; nFlops = nFlops + 1) {
    iVar1 = Vec_IntEntry(vRegClasses,nFlops);
    if (iVar1 != iDom) {
      Vec_IntPush(p_00,nFlops);
    }
  }
  iVar1 = Vec_IntSize(p_00);
  for (nFlops = 0; iVar2 = Vec_IntSize(vRegClasses), nFlops < iVar2; nFlops = nFlops + 1) {
    iVar2 = Vec_IntEntry(vRegClasses,nFlops);
    if (iVar2 == iDom) {
      Vec_IntPush(p_00,nFlops);
    }
  }
  iVar2 = Vec_IntSize(p_00);
  iVar3 = Vec_IntSize(p_00);
  iVar4 = Gia_ManRegNum(p);
  if (iVar3 != iVar4) {
    __assert_fail("Vec_IntSize(vPerm) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x272,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  p_01 = Gia_ManDupPermFlop(p,p_00);
  iVar3 = Gia_ManObjNum(p_01);
  iVar4 = Gia_ManObjNum(p);
  if (iVar3 != iVar4) {
    __assert_fail("Gia_ManObjNum(pNew) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x275,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  Vec_IntFree(p_00);
  p_01->nRegs = iVar2 - iVar1;
  if (pParsS == (void *)0x0) {
    Gia_ManSeqCleanupClasses(p_01,fConst,fEquiv,fVerbose);
  }
  else {
    Cec_ManLSCorrespondenceClasses(p_01,(Cec_ParCor_t *)pParsS);
  }
  iVar1 = Gia_ManRegNum(p);
  p_01->nRegs = iVar1;
  nFlops = 0;
  while( true ) {
    bVar7 = false;
    if (nFlops < p->nObjs) {
      vPerm = (Vec_Int_t *)Gia_ManObj(p,nFlops);
      bVar7 = vPerm != (Vec_Int_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Abc_LitIsCompl(*(int *)&vPerm->pArray);
    if (iVar1 != 0) {
      __assert_fail("!Abc_LitIsCompl(pObj->Value)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                    ,0x281,
                    "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                   );
    }
    uVar5 = Abc_Var2Lit(nFlops,0);
    iVar1 = Abc_Lit2Var(*(int *)&vPerm->pArray);
    pGVar6 = Gia_ManObj(p_01,iVar1);
    pGVar6->Value = uVar5;
    nFlops = nFlops + 1;
  }
  Gia_ManDupRemapEquiv(p,p_01);
  Gia_ManStop(p_01);
  return;
}

Assistant:

void Gia_ManSweepComputeOneDomainEquivs( Gia_Man_t * p, Vec_Int_t * vRegClasses, int iDom, void * pParsS, int fConst, int fEquiv, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vPerm;
    int i, Class, nFlops;
    int nDoms = Vec_IntFindMax(vRegClasses);
    assert( iDom >= 1 && iDom <= nDoms );
    assert( p->pManTime == NULL );
    assert( Gia_ManRegNum(p) > 0 );
    // create required flop permutation
    vPerm = Vec_IntAlloc( Gia_ManRegNum(p) );
    Vec_IntForEachEntry( vRegClasses, Class, i )
        if ( Class != iDom )
            Vec_IntPush( vPerm, i );
    nFlops = Vec_IntSize( vPerm );
    Vec_IntForEachEntry( vRegClasses, Class, i )
        if ( Class == iDom )
            Vec_IntPush( vPerm, i );
    nFlops = Vec_IntSize(vPerm) - nFlops;
    assert( Vec_IntSize(vPerm) == Gia_ManRegNum(p) );
    // derive new AIG
    pNew = Gia_ManDupPermFlop( p, vPerm );
    assert( Gia_ManObjNum(pNew) == Gia_ManObjNum(p) );
    Vec_IntFree( vPerm );
    // perform computation of equivalences 
    pNew->nRegs = nFlops;
    if ( pParsS )
        Cec_ManLSCorrespondenceClasses( pNew, (Cec_ParCor_t *)pParsS );
    else 
        Gia_ManSeqCleanupClasses( pNew, fConst, fEquiv, fVerbose );
    pNew->nRegs = Gia_ManRegNum(p);
    // make new point to old
    Gia_ManForEachObj( p, pObj, i )
    {
        assert( !Abc_LitIsCompl(pObj->Value) );
        Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value))->Value = Abc_Var2Lit(i, 0);
    }
    // transfer
    Gia_ManDupRemapEquiv( p, pNew );
    Gia_ManStop( pNew );
}